

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O3

unique_ptr<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>_>
__thiscall
Storage::Encodings::MFM::GetMFMEncoder
          (MFM *this,vector<bool,_std::allocator<bool>_> *target,
          vector<bool,_std::allocator<bool>_> *fuzzy_target)

{
  undefined8 *puVar1;
  int c;
  long lVar2;
  uint uVar3;
  int iVar4;
  
  puVar1 = (undefined8 *)operator_new(0x228);
  *(undefined2 *)(puVar1 + 0x41) = 0xffff;
  lVar2 = 0;
  do {
    uVar3 = (int)lVar2 << 8;
    iVar4 = 8;
    do {
      uVar3 = uVar3 * 2 ^ (uint)(int)(short)uVar3 >> 0xf & 0x1021;
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    *(short *)((long)puVar1 + lVar2 * 2 + 8) = (short)uVar3;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x100);
  puVar1[0x42] = target;
  puVar1[0x43] = fuzzy_target;
  *puVar1 = &PTR__Encoder_005a2d30;
  *(undefined8 **)this = puVar1;
  return (__uniq_ptr_data<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>,_true,_true>
          )(__uniq_ptr_data<Storage::Encodings::MFM::Encoder,_std::default_delete<Storage::Encodings::MFM::Encoder>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Encoder> Storage::Encodings::MFM::GetMFMEncoder(std::vector<bool> &target, std::vector<bool> *fuzzy_target) {
	return std::make_unique<MFMEncoder>(target, fuzzy_target);
}